

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

char * sqlite3DbSpanDup(sqlite3 *db,char *zStart,char *zEnd)

{
  int iVar1;
  char *pcVar2;
  char *in_RDX;
  sqlite3 *in_RSI;
  int n;
  undefined4 in_stack_ffffffffffffffe0;
  
  while ((""[*(byte *)&in_RSI->pVfs] & 1) != 0) {
    in_RSI = (sqlite3 *)((long)&in_RSI->pVfs + 1);
  }
  iVar1 = (int)in_RDX - (int)in_RSI;
  while ((""[*(byte *)((long)&in_RSI->pVfs + (long)(iVar1 + -1))] & 1) != 0) {
    iVar1 = iVar1 + -1;
  }
  pcVar2 = sqlite3DbStrNDup(in_RSI,in_RDX,CONCAT44(iVar1,in_stack_ffffffffffffffe0));
  return pcVar2;
}

Assistant:

SQLITE_PRIVATE char *sqlite3DbSpanDup(sqlite3 *db, const char *zStart, const char *zEnd){
  int n;
#ifdef SQLITE_DEBUG
  /* Because of the way the parser works, the span is guaranteed to contain
  ** at least one non-space character */
  for(n=0; sqlite3Isspace(zStart[n]); n++){ assert( &zStart[n]<zEnd ); }
#endif
  while( sqlite3Isspace(zStart[0]) ) zStart++;
  n = (int)(zEnd - zStart);
  while( sqlite3Isspace(zStart[n-1]) ) n--;
  return sqlite3DbStrNDup(db, zStart, n);
}